

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TraceBuffer::WriteChunkRecord
          (TraceBuffer *this,uint8_t *wptr,ChunkRecord *record,uint8_t *src,size_t size)

{
  ushort uVar1;
  uint uVar2;
  code *pcVar3;
  size_t sVar4;
  uint8_t *puVar5;
  char *pcVar6;
  uint *puVar7;
  int *piVar8;
  char *pcVar9;
  size_t rounding_size;
  size_t size_local;
  uint8_t *src_local;
  ChunkRecord *record_local;
  uint8_t *wptr_local;
  TraceBuffer *this_local;
  
  uVar1 = record->size;
  sVar4 = size_to_end(this);
  if (sVar4 < uVar1) {
    pcVar6 = perfetto::base::Basename
                       (
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
    puVar7 = (uint *)__errno_location();
    uVar2 = *puVar7;
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    perfetto::base::LogMessage
              (kLogError,pcVar6,0xc22f,"%s (errno: %d, %s)",
               "PERFETTO_CHECK(record.size <= size_to_end())",(ulong)uVar2,pcVar9);
    perfetto::base::MaybeSerializeLastLogsForCrashReporting();
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  DcheckIsAlignedAndWithinBounds(this,wptr);
  uVar1 = record->size;
  puVar5 = begin(this);
  perfetto::base::PagedMemory::EnsureCommitted
            (&this->data_,(size_t)(wptr + ((long)(int)(uint)uVar1 - (long)puVar5)));
  puVar5 = end(this);
  if (puVar5 < wptr + size + 0x10) {
    pcVar6 = perfetto::base::Basename
                       (
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
    puVar7 = (uint *)__errno_location();
    uVar2 = *puVar7;
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    perfetto::base::LogMessage
              (kLogError,pcVar6,0xc236,"%s (errno: %d, %s)",
               "PERFETTO_CHECK(wptr + sizeof(record) + size <= end())",(ulong)uVar2,pcVar9);
    perfetto::base::MaybeSerializeLastLogsForCrashReporting();
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *(undefined8 *)wptr = *(undefined8 *)record;
  *(undefined8 *)(wptr + 8) = *(undefined8 *)&record->num_fragments;
  if (src != (uint8_t *)0x0) {
    memcpy(wptr + 0x10,src,size);
  }
  memset(wptr + size + 0x10,0,((ulong)record->size - 0x10) - size);
  return;
}

Assistant:

void WriteChunkRecord(uint8_t* wptr,
                        const ChunkRecord& record,
                        const uint8_t* src,
                        size_t size) {
    // Note: |record.size| will be slightly bigger than |size| because of the
    // ChunkRecord header and rounding, to ensure that all ChunkRecord(s) are
    // multiple of sizeof(ChunkRecord). The invariant is:
    // record.size >= |size| + sizeof(ChunkRecord) (== if no rounding).
    PERFETTO_DCHECK(size <= ChunkRecord::kMaxSize);
    PERFETTO_DCHECK(record.size >= sizeof(record));
    PERFETTO_DCHECK(record.size % sizeof(record) == 0);
    PERFETTO_DCHECK(record.size >= size + sizeof(record));
    PERFETTO_CHECK(record.size <= size_to_end());
    DcheckIsAlignedAndWithinBounds(wptr);

    // We may be writing to this area for the first time.
    data_.EnsureCommitted(static_cast<size_t>(wptr + record.size - begin()));

    // Deliberately not a *D*CHECK.
    PERFETTO_CHECK(wptr + sizeof(record) + size <= end());
    memcpy(wptr, &record, sizeof(record));
    if (PERFETTO_LIKELY(src)) {
      // If the producer modifies the data in the shared memory buffer while we
      // are copying it to the central buffer, TSAN will (rightfully) flag that
      // as a race. However the entire purpose of copying the data into the
      // central buffer is that we can validate it without worrying that the
      // producer changes it from under our feet, so this race is benign. The
      // alternative would be to try computing which part of the buffer is safe
      // to read (assuming a well-behaving client), but the risk of introducing
      // a bug that way outweighs the benefit.
      PERFETTO_ANNOTATE_BENIGN_RACE_SIZED(
          src, size, "Benign race when copying chunk from shared memory.")
      memcpy(wptr + sizeof(record), src, size);
    } else {
      PERFETTO_DCHECK(size == record.size - sizeof(record));
    }
    const size_t rounding_size = record.size - sizeof(record) - size;
    memset(wptr + sizeof(record) + size, 0, rounding_size);
  }